

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O2

int __thiscall
cinatra::radix_tree::insert
          (radix_tree *this,string *path,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler,
          string *method)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  ulong uVar5;
  element_type *peVar6;
  bool bVar7;
  __type_conflict3 _Var8;
  int iVar9;
  int iVar10;
  uint start;
  uint uVar11;
  ulong __pos;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler_00;
  uint uVar12;
  ulong __pos_00;
  bool bVar13;
  ulong local_1a8;
  shared_ptr<cinatra::radix_tree_node> root;
  int local_184;
  shared_ptr<cinatra::radix_tree_node> child_1;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Any_data local_128;
  _Manager_type local_118;
  undefined1 auStack_110 [8];
  shared_ptr<cinatra::radix_tree_node> child;
  undefined1 local_f0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_b0;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_90;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_70;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_50;
  
  std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)this);
  uVar3 = path->_M_string_length;
  uVar12 = (uint)uVar3;
  iVar10 = 0;
  local_184 = 0;
  local_1a8 = 0;
  do {
    uVar11 = (uint)local_1a8;
    if ((int)uVar12 <= (int)uVar11) break;
    __pos = (ulong)(int)uVar11;
    if (((root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        indices)._M_string_length != 0) {
      cVar1 = *((root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->indices)._M_dataplus._M_p;
      if (cVar1 != '*') {
        cVar2 = (path->_M_dataplus)._M_p[__pos];
        if (cVar2 == ':') {
          if (cVar1 == ':') {
            iVar9 = find_pos(this,path,'/',uVar11);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,path,(long)(int)(uVar11 + 1),(long)(int)(~uVar11 + iVar9));
            _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_148,
                                    &(((((root.
                                          super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->children).
                                        super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->path);
            std::__cxx11::string::~string((string *)local_148);
            if (_Var8) goto LAB_001331c5;
          }
        }
        else if ((cVar2 != '*') && (cVar1 != ':')) goto LAB_001331c5;
      }
      iVar10 = -1;
      break;
    }
LAB_001331c5:
    radix_tree_node::get_child
              ((radix_tree_node *)&child,
               (char)root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    if (child.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      start = find_pos(this,path,':',uVar11);
      peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (start != uVar12) {
        cVar1 = (path->_M_dataplus)._M_p[__pos];
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   path,__pos,(long)(int)(start - uVar11));
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 0x10));
        radix_tree_node::insert_child
                  ((radix_tree_node *)&child_1,(char)peVar6,
                   (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
        std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)&child_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&child_1.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
        std::__cxx11::string::~string((string *)local_148);
        uVar11 = find_pos(this,path,'/',start);
        peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_1a8 = (ulong)uVar11;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   path,(long)(int)(start + 1),(long)(int)(~start + uVar11));
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
        radix_tree_node::insert_child
                  ((radix_tree_node *)&child_1,(char)peVar6,
                   (shared_ptr<cinatra::radix_tree_node> *)0x3a);
        std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)&child_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&child_1.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
        std::__cxx11::string::~string((string *)local_148);
        peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_184 = local_184 + 1;
        if (uVar11 == uVar12) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function(&local_b0,handler);
          handler_00 = &local_b0;
          iVar10 = radix_tree_node::add_handler(peVar6,handler_00,method);
          goto LAB_001336f7;
        }
        bVar7 = true;
        goto LAB_00133706;
      }
      iVar10 = find_pos(this,path,'*',uVar11);
      peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cVar1 = (path->_M_dataplus)._M_p[__pos];
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,path
                 ,__pos,(long)(int)(iVar10 - uVar11));
      std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x10));
      radix_tree_node::insert_child
                ((radix_tree_node *)&child_1,(char)peVar6,
                 (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
      std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)&child_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&child_1.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
      std::__cxx11::string::~string((string *)local_148);
      peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (iVar10 < (int)uVar12) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   path,(long)(iVar10 + 1),0xffffffffffffffff);
        std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
        radix_tree_node::insert_child
                  ((radix_tree_node *)&child_1,(char)peVar6,
                   (shared_ptr<cinatra::radix_tree_node> *)0x2a);
        std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)&child_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&child_1.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
        std::__cxx11::string::~string((string *)local_148);
        local_184 = local_184 + 1;
      }
      peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      handler_00 = &local_50;
      std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                (handler_00,handler);
      iVar10 = radix_tree_node::add_handler(peVar6,handler_00,method);
LAB_001336fe:
      std::_Function_base::~_Function_base(&handler_00->super__Function_base);
      bVar7 = false;
    }
    else {
      std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>,
                 &child.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>);
      peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar4 = (path->_M_dataplus)._M_p;
      if (pcVar4[__pos] == ':') {
        local_184 = local_184 + 1;
        uVar11 = uVar11 + (int)((root.
                                 super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->path)._M_string_length + 1;
        bVar7 = true;
        local_1a8 = (ulong)uVar11;
        if (uVar11 == uVar12) {
          handler_00 = &local_70;
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function(handler_00,handler);
          iVar10 = radix_tree_node::add_handler(peVar6,handler_00,method);
LAB_001336f7:
          local_1a8 = uVar3 & 0xffffffff;
          goto LAB_001336fe;
        }
      }
      else {
        uVar5 = ((root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->path)._M_string_length;
        for (__pos_00 = 0; ((long)__pos < (long)(int)uVar12 && (__pos_00 < uVar5));
            __pos_00 = __pos_00 + 1) {
          if (pcVar4[__pos] !=
              ((root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->path)._M_dataplus._M_p[__pos_00]) goto LAB_00133542;
          __pos = __pos + 1;
        }
        if (__pos_00 < uVar5) {
LAB_00133542:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->path,__pos_00,0xffffffffffffffff);
          std::make_shared<cinatra::radix_tree_node,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child_1);
          std::__cxx11::string::~string((string *)local_148);
          handler_t::operator=
                    (&(child_1.
                       super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->handler,
                     &(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->handler);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(child_1.
                       super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->indices,
                     &(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->indices);
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
          ::operator=(&(child_1.
                        super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->children,
                      &(root.
                        super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->children);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->path,0,__pos_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148)
          ;
          std::__cxx11::string::~string((string *)local_148);
          local_148._0_8_ = &local_138;
          local_148._8_8_ = (void *)0x0;
          local_138._M_local_buf[0] = '\0';
          local_118 = (_Manager_type)0x0;
          auStack_110 = (undefined1  [8])0x0;
          local_128._M_unused._M_object = (_Invoker_type)0x0;
          local_128._8_8_ = (pointer)0x0;
          handler_t::operator=
                    (&(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->handler,(handler_t *)local_148);
          handler_t::~handler_t((handler_t *)local_148);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->indices,
                     *((child_1.
                        super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->path)._M_dataplus._M_p);
          std::__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)local_148
                     ,(__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)&child_1
                    );
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
          ::_M_assign_aux<std::shared_ptr<cinatra::radix_tree_node>const*>
                    ((vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
                      *)&(root.
                          super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->children,
                     (__shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2> *)local_148
                     ,&local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&child_1.
                      super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        peVar6 = root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        bVar7 = true;
        local_1a8._0_4_ = (uint)__pos;
        bVar13 = (uint)local_1a8 == uVar12;
        local_1a8 = __pos;
        if (bVar13) {
          handler_00 = &local_90;
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function(handler_00,handler);
          iVar10 = radix_tree_node::add_handler(peVar6,handler_00,method);
          goto LAB_001336f7;
        }
      }
    }
LAB_00133706:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&child.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while (bVar7);
  peVar6 = (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar6->max_params < local_184) {
    peVar6->max_params = local_184;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar10;
}

Assistant:

int insert(
      const std::string &path,
      std::function<void(coro_http_request &req, coro_http_response &resp)>
          handler,
      const std::string &method) {
    auto root = this->root;
    int i = 0, n = path.size(), param_count = 0, code = 0;
    while (i < n) {
      if (!root->indices.empty() &&
          (root->indices[0] == type_asterisk || path[i] == type_asterisk ||
           (path[i] != type_colon && root->indices[0] == type_colon) ||
           (path[i] == type_colon && root->indices[0] != type_colon) ||
           (path[i] == type_colon && root->indices[0] == type_colon &&
            path.substr(i + 1, find_pos(path, type_slash, i) - i - 1) !=
                root->children[0]->path))) {
        code = -1;
        break;
      }

      auto child = root->get_child(path[i]);
      if (!child) {
        auto p = find_pos(path, type_colon, i);

        if (p == n) {
          p = find_pos(path, type_asterisk, i);

          root = root->insert_child(path[i], std::make_shared<radix_tree_node>(
                                                 path.substr(i, p - i)));

          if (p < n) {
            root = root->insert_child(
                type_asterisk,
                std::make_shared<radix_tree_node>(path.substr(p + 1)));
            ++param_count;
          }

          code = root->add_handler(handler, method);
          break;
        }

        root = root->insert_child(
            path[i], std::make_shared<radix_tree_node>(path.substr(i, p - i)));

        i = find_pos(path, type_slash, p);

        root = root->insert_child(
            type_colon,
            std::make_shared<radix_tree_node>(path.substr(p + 1, i - p - 1)));
        ++param_count;

        if (i == n) {
          code = root->add_handler(handler, method);
          break;
        }
      }
      else {
        root = child;

        if (path[i] == type_colon) {
          ++param_count;
          i += root->path.size() + 1;

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
        else {
          auto j = 0UL;
          auto m = root->path.size();

          for (; i < n && j < m && path[i] == root->path[j]; ++i, ++j) {
          }

          if (j < m) {
            std::shared_ptr<radix_tree_node> child(
                std::make_shared<radix_tree_node>(root->path.substr(j)));
            child->handler = root->handler;
            child->indices = root->indices;
            child->children = root->children;

            root->path = root->path.substr(0, j);
            root->handler = {};
            root->indices = child->path[0];
            root->children = {child};
          }

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
      }
    }

    if (param_count > this->root->max_params)
      this->root->max_params = param_count;

    return code;
  }